

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O1

al_fixed al_fixatan(al_fixed x)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = (uint)x >> 0x18 & 0xffffff80;
  iVar3 = uVar5 + 0x7f;
  do {
    iVar4 = (int)(uVar5 + iVar3) >> 1;
    iVar1 = _al_fix_tan_tbl[iVar4];
    uVar2 = iVar4 + 1;
    if (x - iVar1 < 1) {
      uVar2 = uVar5;
    }
    uVar5 = uVar2;
    iVar6 = iVar4 + -1;
    if (-1 < x - iVar1) {
      iVar6 = iVar3;
    }
    if (iVar1 < x) {
      iVar6 = iVar3;
    }
    iVar3 = iVar6;
  } while ((x != iVar1) && ((int)uVar5 <= iVar3));
  iVar3 = iVar4 * 0x8000 + -0x800000;
  if (-1 < x) {
    iVar3 = iVar4 * 0x8000;
  }
  return iVar3;
}

Assistant:

al_fixed al_fixatan(al_fixed x)
{
   int a, b, c;            /* for binary search */
   al_fixed d;                /* difference value for search */

   if (x >= 0) {           /* search the first part of tan table */
      a = 0;
      b = 127;
   }
   else {                  /* search the second half instead */
      a = 128;
      b = 255;
   }

   do {
      c = (a + b) >> 1;
      d = x - _al_fix_tan_tbl[c];

      if (d > 0)
	 a = c + 1;
      else
	 if (d < 0)
	    b = c - 1;

   } while ((a <= b) && (d));

   if (x >= 0)
      return ((long)c) << 15;

   return (-0x00800000L + (((long)c) << 15));
}